

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.c
# Opt level: O1

ecs_data_t *
ecs_table_merge(ecs_world_t *world,ecs_table_t *new_table,ecs_table_t *old_table,
               ecs_data_t *new_data,ecs_data_t *old_data)

{
  short sVar1;
  int iVar2;
  ulong uVar3;
  ecs_vector_t *peVar4;
  ecs_c_info_t *peVar5;
  ecs_column_t *peVar6;
  ecs_move_t p_Var7;
  int *piVar8;
  ecs_vector_t *peVar9;
  ecs_sw_column_t *peVar10;
  short sVar11;
  uint count;
  int32_t new_index;
  int32_t iVar12;
  int32_t count_00;
  void *pvVar13;
  void *pvVar14;
  undefined8 *puVar15;
  ecs_entity_t *entities;
  void *__src;
  size_t sVar16;
  int16_t iVar17;
  int iVar18;
  char *pcVar19;
  int16_t extraout_DX;
  int16_t extraout_DX_00;
  int16_t size;
  int16_t size_00;
  ecs_column_t *peVar20;
  int iVar21;
  long lVar22;
  void *__dest;
  ecs_column_t *peVar23;
  int elem_count;
  int iVar24;
  ulong uVar25;
  long lVar26;
  ecs_column_t *peVar27;
  int iVar28;
  bool bVar29;
  ecs_vector_t *local_50;
  void *local_48;
  void *local_40;
  ecs_entity_t *local_38;
  
  pcVar19 = "old_table != NULL";
  _ecs_assert(old_table != (ecs_table_t *)0x0,0xc,(char *)0x0,"old_table != NULL",
              "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/src/table.c"
              ,0x7b0);
  if (old_table == (ecs_table_t *)0x0) {
    __assert_fail("old_table != ((void*)0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/src/table.c"
                  ,0x7b0,
                  "ecs_data_t *ecs_table_merge(ecs_world_t *, ecs_table_t *, ecs_table_t *, ecs_data_t *, ecs_data_t *)"
                 );
  }
  if (new_table == (ecs_table_t *)0x0) {
    ecs_table_clear_data(world,old_table,old_data);
  }
  else if (old_data != (ecs_data_t *)0x0) {
    bVar29 = new_data == (ecs_data_t *)0x0;
    if (bVar29) {
      new_data = get_data_intern(new_table,true);
    }
    pvVar13 = _ecs_vector_first(old_data->entities,8,0x10);
    count = ecs_vector_count(old_data->entities);
    new_index = ecs_vector_count(new_data->entities);
    pvVar14 = _ecs_vector_first(old_data->record_ptrs,8,0x10);
    iVar17 = (int16_t)pcVar19;
    if (0 < (int)count) {
      uVar25 = 0;
      do {
        if (new_table == old_table) {
          puVar15 = (undefined8 *)
                    _ecs_sparse_get_or_create
                              ((world->store).entity_index,0x10,
                               *(uint64_t *)((long)pvVar13 + uVar25 * 8));
        }
        else {
          puVar15 = *(undefined8 **)((long)pvVar14 + uVar25 * 8);
          pcVar19 = "record != NULL";
          _ecs_assert(puVar15 != (undefined8 *)0x0,0xc,(char *)0x0,"record != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/src/table.c"
                      ,0x7d3);
          if (puVar15 == (undefined8 *)0x0) {
            __assert_fail("record != ((void*)0)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/src/table.c"
                          ,0x7d3,
                          "ecs_data_t *ecs_table_merge(ecs_world_t *, ecs_table_t *, ecs_table_t *, ecs_data_t *, ecs_data_t *)"
                         );
          }
        }
        iVar12 = ecs_row_to_record(new_index + (int)uVar25,
                                   SUB41((uint)*(undefined4 *)(puVar15 + 1) >> 0x1f,0));
        iVar17 = (int16_t)pcVar19;
        *(int32_t *)(puVar15 + 1) = iVar12;
        *puVar15 = new_table;
        uVar25 = uVar25 + 1;
      } while (count != uVar25);
    }
    if (bVar29 && new_table == old_table) {
      new_data->bs_columns = old_data->bs_columns;
      peVar4 = old_data->entities;
      peVar9 = old_data->record_ptrs;
      peVar10 = old_data->sw_columns;
      new_data->columns = old_data->columns;
      new_data->sw_columns = peVar10;
      new_data->entities = peVar4;
      new_data->record_ptrs = peVar9;
    }
    else {
      iVar28 = new_table->column_count;
      iVar2 = old_table->column_count;
      pvVar13 = _ecs_vector_first(new_table->type,8,0x10);
      pvVar14 = _ecs_vector_first(old_table->type,8,0x10);
      peVar27 = old_data->columns;
      peVar20 = new_data->columns;
      size = extraout_DX;
      if (peVar20 == (ecs_column_t *)0x0) {
        if (new_data->entities == (ecs_vector_t *)0x0) {
          ecs_init_data(world,new_table,new_data);
          peVar20 = new_data->columns;
          size = extraout_DX_00;
        }
        else {
          peVar20 = (ecs_column_t *)0x0;
        }
      }
      if (count != 0) {
        merge_vector(&new_data->entities,old_data->entities,size,iVar17);
        old_data->entities = (ecs_vector_t *)0x0;
        entities = (ecs_entity_t *)_ecs_vector_first(new_data->entities,8,0x10);
        iVar12 = ecs_vector_count(new_data->entities);
        elem_count = count + new_index;
        iVar17 = 0x21de;
        _ecs_assert(iVar12 == elem_count,0xc,(char *)0x0,
                    "ecs_vector_count(new_data->entities) == old_count + new_count",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/src/table.c"
                    ,0x725);
        iVar12 = ecs_vector_count(new_data->entities);
        if (iVar12 != elem_count) {
          __assert_fail("ecs_vector_count(new_data->entities) == old_count + new_count",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/src/table.c"
                        ,0x725,
                        "void merge_table_data(ecs_world_t *, ecs_table_t *, ecs_table_t *, int32_t, int32_t, ecs_data_t *, ecs_data_t *)"
                       );
        }
        merge_vector(&new_data->record_ptrs,old_data->record_ptrs,size_00,iVar17);
        old_data->record_ptrs = (ecs_vector_t *)0x0;
        iVar21 = 0;
        iVar24 = 0;
        do {
          if ((iVar28 <= iVar21) || (iVar2 <= iVar24)) break;
          lVar22 = (long)iVar21;
          uVar25 = *(ulong *)((long)pvVar13 + lVar22 * 8);
          lVar26 = (long)iVar24;
          uVar3 = *(ulong *)((long)pvVar14 + lVar26 * 8);
          if (uVar3 < 0x100000000000000 && uVar25 < 0x100000000000000) {
            if (uVar25 == uVar3) {
              peVar4 = peVar27[lVar26].data;
              local_38 = (ecs_entity_t *)_ecs_vector_first(new_data->entities,8,0x10);
              peVar5 = new_table->c_info[lVar22];
              peVar6 = new_data->columns;
              peVar23 = peVar6 + lVar22;
              local_50 = peVar6[lVar22].data;
              sVar11 = peVar6[lVar22].size;
              sVar1 = peVar6[lVar22].alignment;
              iVar12 = ecs_vector_count(local_50);
              if (iVar12 == 0) {
                if (local_50 != (ecs_vector_t *)0x0) {
                  ecs_vector_free(local_50);
                }
                peVar23->data = peVar4;
              }
              else {
                count_00 = ecs_vector_count(peVar4);
                iVar17 = 0x10;
                if (0x10 < sVar1) {
                  iVar17 = sVar1;
                }
                local_40 = (void *)CONCAT44(local_40._4_4_,(int)sVar11);
                _ecs_vector_set_count(&local_50,(int)sVar11,iVar17,count_00 + iVar12);
                peVar23->data = local_50;
                if (peVar5 != (ecs_c_info_t *)0x0) {
                  ctor_component(world,peVar5,peVar23,local_38,iVar12,count_00);
                }
                iVar18 = (int)local_40;
                local_48 = _ecs_vector_first(local_50,(int)local_40,iVar17);
                __src = _ecs_vector_first(peVar4,iVar18,iVar17);
                __dest = (void *)((long)(iVar12 * iVar18) + (long)local_48);
                if ((peVar5 == (ecs_c_info_t *)0x0) ||
                   (p_Var7 = (peVar5->lifecycle).move, p_Var7 == (ecs_move_t)0x0)) {
                  memcpy(__dest,__src,(long)(count_00 * iVar18));
                }
                else {
                  local_48 = (void *)peVar5->component;
                  local_40 = __src;
                  sVar16 = ecs_to_size_t((long)iVar18);
                  (*p_Var7)(world,(ecs_entity_t)local_48,local_38,local_38,__dest,local_40,sVar16,
                            count_00,(peVar5->lifecycle).ctx);
                }
                ecs_vector_free(peVar4);
              }
              peVar27[lVar26].data = (ecs_vector_t *)0x0;
              iVar21 = iVar21 + 1;
              if (new_table->dirty_state != (int32_t *)0x0) {
                piVar8 = new_table->dirty_state + iVar21;
                *piVar8 = *piVar8 + 1;
              }
              iVar24 = iVar24 + 1;
            }
            else {
              sVar11 = peVar20[lVar22].size;
              if (uVar25 < uVar3) {
                if (sVar11 != 0) {
                  iVar17 = 0x10;
                  if (0x10 < peVar20[lVar22].alignment) {
                    iVar17 = peVar20[lVar22].alignment;
                  }
                  _ecs_vector_set_count(&peVar20[lVar22].data,(int)sVar11,iVar17,elem_count);
                  peVar5 = new_table->c_info[lVar22];
                  if ((peVar5 != (ecs_c_info_t *)0x0) &&
                     ((peVar5->lifecycle).ctor != (ecs_xtor_t)0x0)) {
                    ctor_component(world,peVar5,peVar20 + lVar22,entities,0,elem_count);
                  }
                }
                iVar21 = iVar21 + 1;
              }
              else if ((uVar3 < uVar25) && (sVar11 != 0)) {
                peVar23 = peVar27 + lVar26;
                peVar5 = old_table->c_info[lVar26];
                if ((peVar5 != (ecs_c_info_t *)0x0) && ((peVar5->lifecycle).dtor != (ecs_xtor_t)0x0)
                   ) {
                  dtor_component(world,peVar5,peVar23,entities,0,count);
                }
                ecs_vector_free(peVar23->data);
                peVar23->data = (ecs_vector_t *)0x0;
                iVar24 = iVar24 + 1;
              }
            }
          }
        } while (uVar3 < 0x100000000000000 && uVar25 < 0x100000000000000);
        move_switch_columns(new_table,new_data,new_index,old_table,old_data,0,count);
        iVar18 = iVar28 - iVar21;
        if (iVar18 != 0 && iVar21 <= iVar28) {
          lVar22 = (long)iVar21;
          peVar20 = peVar20 + lVar22;
          do {
            if (peVar20->size != 0) {
              sVar11 = peVar20->alignment;
              if (peVar20->alignment < 0x11) {
                sVar11 = 0x10;
              }
              _ecs_vector_set_count(&peVar20->data,(int)peVar20->size,sVar11,elem_count);
              peVar5 = new_table->c_info[lVar22];
              if ((peVar5 != (ecs_c_info_t *)0x0) && ((peVar5->lifecycle).ctor != (ecs_xtor_t)0x0))
              {
                ctor_component(world,peVar5,peVar20,entities,0,elem_count);
              }
            }
            lVar22 = lVar22 + 1;
            peVar20 = peVar20 + 1;
            iVar18 = iVar18 + -1;
          } while (iVar18 != 0);
        }
        iVar28 = iVar2 - iVar24;
        if (iVar28 != 0 && iVar24 <= iVar2) {
          lVar22 = (long)iVar24;
          peVar27 = peVar27 + lVar22;
          do {
            peVar5 = old_table->c_info[lVar22];
            if ((peVar5 != (ecs_c_info_t *)0x0) && ((peVar5->lifecycle).dtor != (ecs_xtor_t)0x0)) {
              dtor_component(world,peVar5,peVar27,entities,0,count);
            }
            ecs_vector_free(peVar27->data);
            peVar27->data = (ecs_vector_t *)0x0;
            lVar22 = lVar22 + 1;
            peVar27 = peVar27 + 1;
            iVar28 = iVar28 + -1;
          } while (iVar28 != 0);
        }
        piVar8 = new_table->dirty_state;
        if (piVar8 != (int *)0x0) {
          *piVar8 = *piVar8 + 1;
        }
      }
    }
    new_table->alloc_count = new_table->alloc_count + 1;
    if (count == 0 || new_index != 0) {
      return new_data;
    }
    ecs_table_activate(world,new_table,(ecs_query_t *)0x0,true);
    return new_data;
  }
  return (ecs_data_t *)0x0;
}

Assistant:

ecs_data_t* ecs_table_merge(
    ecs_world_t * world,
    ecs_table_t *new_table,
    ecs_table_t *old_table,
    ecs_data_t *new_data,
    ecs_data_t *old_data)
{
    ecs_assert(old_table != NULL, ECS_INTERNAL_ERROR, NULL);
    bool move_data = false;
    
    /* If there is nothing to merge to, just clear the old table */
    if (!new_table) {
        ecs_table_clear_data(world, old_table, old_data);
        return NULL;
    }

    /* If there is no data to merge, drop out */
    if (!old_data) {
        return NULL;
    }

    if (!new_data) {
        new_data = ecs_table_get_or_create_data(new_table);
        if (new_table == old_table) {
            move_data = true;
        }
    }

    ecs_entity_t *old_entities = ecs_vector_first(old_data->entities, ecs_entity_t);

    int32_t old_count = ecs_vector_count(old_data->entities);
    int32_t new_count = ecs_vector_count(new_data->entities);

    ecs_record_t **old_records = ecs_vector_first(
        old_data->record_ptrs, ecs_record_t*);

    /* First, update entity index so old entities point to new type */
    int32_t i;
    for(i = 0; i < old_count; i ++) {
        ecs_record_t *record;
        if (new_table != old_table) {
            record = old_records[i];
            ecs_assert(record != NULL, ECS_INTERNAL_ERROR, NULL);
        } else {
            record = ecs_eis_get_or_create(world, old_entities[i]);
        }

        bool is_monitored = record->row < 0;
        record->row = ecs_row_to_record(new_count + i, is_monitored);
        record->table = new_table;
    }

    /* Merge table columns */
    if (move_data) {
        *new_data = *old_data;
    } else {
        merge_table_data(world, new_table, old_table, old_count, new_count, 
            old_data, new_data);
    }

    new_table->alloc_count ++;

    if (!new_count && old_count) {
        ecs_table_activate(world, new_table, NULL, true);
    }

    return new_data;
}